

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O3

int IDAComputeY(void *ida_mem,N_Vector ycor,N_Vector y)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x65f,"IDAComputeY",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    N_VLinearSum(0x3ff0000000000000,0,*(undefined8 *)((long)ida_mem + 0x198));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAComputeY(void* ida_mem, N_Vector ycor, N_Vector y)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  N_VLinearSum(ONE, IDA_mem->ida_yypredict, ONE, ycor, y);

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}